

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserFilter.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyParserFilter::ParseValue
          (PropertyParserFilter *this,Property *property,String *filter_string_value,
          ParameterMap *param_3)

{
  pointer pcVar1;
  undefined8 uVar2;
  Property *this_00;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  FilterInstancer *pFVar7;
  PropertySpecification *this_01;
  pointer pbVar8;
  String type;
  FilterDeclarationList filters;
  PropertyDictionary properties;
  String shorthand;
  StringList filter_string_list;
  String local_158;
  vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_> local_138;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  pointer pFStack_108;
  undefined1 local_100 [32];
  size_t local_e0;
  undefined8 uStack_d8;
  String local_d0;
  undefined1 local_b0 [72];
  size_t local_68;
  undefined8 uStack_60;
  StringList local_58;
  Property *local_40;
  pointer local_38;
  
  if ((filter_string_value->_M_string_length == 0) ||
     (iVar4 = ::std::__cxx11::string::compare((char *)filter_string_value), iVar4 == 0)) {
    local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_b0,(FiltersPtr *)&local_138);
    Variant::operator=(&property->value,(Variant *)local_b0);
    Variant::~Variant((Variant *)local_b0);
    if (local_138.
        super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_138.
                 super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    property->unit = FILTER;
    return true;
  }
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StringUtilities::ExpandString(&local_58,filter_string_value,' ','(',')',true);
  local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = &local_110;
  local_118 = 0;
  local_110 = 0;
  local_40 = property;
  ::std::__cxx11::string::_M_assign((string *)&local_120);
  ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::reserve
            (&local_138,
             (long)local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_38 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = local_b0 + 0x10;
    pbVar8 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar5 = ::std::__cxx11::string::find((char)pbVar8,0x28);
      uVar6 = ::std::__cxx11::string::rfind((char)pbVar8,0x29);
      if ((uVar6 <= uVar5) || (uVar6 == 0xffffffffffffffff)) {
        bVar3 = false;
        Log::Message(LT_WARNING,"Invalid syntax for font-effect \'%s\'.",(pbVar8->_M_dataplus)._M_p)
        ;
        goto LAB_002596b1;
      }
      ::std::__cxx11::string::substr((ulong)local_b0,(ulong)pbVar8);
      StringUtilities::StripWhitespace(&local_158,(String *)local_b0);
      if ((pointer)local_b0._0_8_ != pcVar1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      pFVar7 = Factory::GetFilterInstancer(&local_158);
      if (pFVar7 == (FilterInstancer *)0x0) {
        Log::Message(LT_WARNING,"Filter type \'%s\' not found.",local_158._M_dataplus._M_p);
LAB_00259693:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002596af;
      }
      ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)pbVar8);
      this_01 = EffectSpecification::GetPropertySpecification(&pFVar7->super_EffectSpecification);
      PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_100);
      local_b0._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"filter","");
      bVar3 = PropertySpecification::ParsePropertyDeclaration
                        (this_01,(PropertyDictionary *)local_100,(String *)local_b0,&local_d0);
      if ((pointer)local_b0._0_8_ != pcVar1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if (!bVar3) {
        StringUtilities::StripWhitespace((String *)local_b0,&local_d0);
        uVar2 = local_b0._8_8_;
        if ((pointer)local_b0._0_8_ != pcVar1) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        if (uVar2 != 0) {
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00259693;
        }
      }
      PropertySpecification::SetPropertyDefaults(this_01,(PropertyDictionary *)local_100);
      local_b0._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      local_b0._40_8_ = local_b0 + 0x40;
      local_b0._56_8_ = 0;
      local_b0._64_8_ = 0;
      local_68 = 0;
      uStack_60._0_4_ = 0x20;
      uStack_60._4_4_ = 0;
      local_b0._48_8_ = local_b0._40_8_;
      if (local_100._24_8_ != 0) {
        local_b0._40_8_ = local_100._0_8_;
        local_b0._48_8_ = local_100._8_8_;
        local_b0._56_8_ = local_100._16_8_;
        local_b0._64_8_ = local_100._24_8_;
        local_68 = local_e0;
        uStack_60._0_4_ = (InfoType)uStack_d8;
        uStack_60._4_4_ = uStack_d8._4_4_;
        local_100._0_8_ = local_100 + 0x18;
        local_100._16_8_ = 0;
        local_100._24_8_ = 0;
        local_e0 = 0;
        uStack_d8._0_4_ = 0x20;
        uStack_d8._4_4_ = 0;
        local_100._8_8_ = local_100._0_8_;
      }
      local_b0._32_8_ = pFVar7;
      ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::
      emplace_back<Rml::FilterDeclaration>(&local_138,(FilterDeclaration *)local_b0);
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 *)(local_b0 + 0x28));
      if ((pointer)local_b0._0_8_ != pcVar1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_38);
  }
  if (local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_002596af:
    bVar3 = false;
  }
  else {
    local_100._0_8_ = (element_type *)0x0;
    local_100._8_8_ = operator_new(0x48);
    this_00 = local_40;
    (((element_type *)local_100._8_8_)->list).
    super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x100000001;
    (((element_type *)local_100._8_8_)->list).
    super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR___Sp_counted_ptr_inplace_00335780;
    local_100._0_8_ =
         &(((element_type *)local_100._8_8_)->list).
          super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    (((element_type *)local_100._8_8_)->list).
    super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_138.
         super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl
         .super__Vector_impl_data._M_start;
    (((element_type *)local_100._8_8_)->value)._M_dataplus._M_p =
         (pointer)local_138.
                  super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (((element_type *)local_100._8_8_)->value)._M_string_length =
         (size_type)
         local_138.
         super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((element_type *)local_100._8_8_)->value).field_2._M_allocated_capacity =
         (size_type)(local_100._8_8_ + 0x38);
    if (local_120 == &local_110) {
      (((element_type *)(local_100._8_8_ + 0x38))->list).
      super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_10f,local_110);
      (((element_type *)(local_100._8_8_ + 0x38))->list).
      super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
      super__Vector_impl_data._M_finish = pFStack_108;
    }
    else {
      (((element_type *)local_100._8_8_)->value).field_2._M_allocated_capacity =
           (size_type)local_120;
      (((element_type *)(local_100._8_8_ + 0x38))->list).
      super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_10f,local_110);
    }
    *(undefined8 *)((long)&(((element_type *)local_100._8_8_)->value).field_2 + 8) = local_118;
    local_118 = 0;
    local_110 = 0;
    local_120 = &local_110;
    Variant::Variant<std::shared_ptr<Rml::FilterDeclarationList>,void>
              ((Variant *)local_b0,(shared_ptr<Rml::FilterDeclarationList> *)local_100);
    Variant::operator=(&this_00->value,(Variant *)local_b0);
    Variant::~Variant((Variant *)local_b0);
    if ((element_type *)local_100._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    this_00->unit = FILTER;
    bVar3 = true;
  }
LAB_002596b1:
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::~vector
            (&local_138);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  return bVar3;
}

Assistant:

bool PropertyParserFilter::ParseValue(Property& property, const String& filter_string_value, const ParameterMap& /*parameters*/) const
{
	// Filters are declared as
	//   filter: <filter-value>[ <filter-value> ...];
	// Where <filter-value> is specified with inline properties
	//   filter: brightness( <shorthand properties> ) ...;

	if (filter_string_value.empty() || filter_string_value == "none")
	{
		property.value = Variant(FiltersPtr());
		property.unit = Unit::FILTER;
		return true;
	}

	RMLUI_ZoneScoped;

	// Make sure we don't split inside the parenthesis since they may appear in filter shorthands.
	StringList filter_string_list;
	StringUtilities::ExpandString(filter_string_list, filter_string_value, ' ', '(', ')', true);

	FilterDeclarationList filters;
	filters.value = filter_string_value;
	filters.list.reserve(filter_string_list.size());

	// Get or instance each filter in the comma-separated string list
	for (const String& filter_string : filter_string_list)
	{
		const size_t shorthand_open = filter_string.find('(');
		const size_t shorthand_close = filter_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);

		if (invalid_parenthesis)
		{
			// We found no parenthesis, filters can only be declared anonymously for now.
			Log::Message(Log::LT_WARNING, "Invalid syntax for font-effect '%s'.", filter_string.c_str());
			return false;
		}
		else
		{
			const String type = StringUtilities::StripWhitespace(filter_string.substr(0, shorthand_open));

			// Check for valid filter type
			FilterInstancer* instancer = Factory::GetFilterInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Filter type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = filter_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'filter' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "filter", shorthand))
			{
				// Empty values are allowed in filters, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
					return false;
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			filters.list.emplace_back(FilterDeclaration{type, instancer, std::move(properties)});
		}
	}

	if (filters.list.empty())
		return false;

	property.value = Variant(MakeShared<FilterDeclarationList>(std::move(filters)));
	property.unit = Unit::FILTER;

	return true;
}